

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::ShaderSubroutine::FunctionalTest17::getTessellationEvaluationShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest17 *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nlayout (quads, point_mode) in;\n\nsubroutine void subroutineTypeTE(out vec4 result);\n\nsubroutine(subroutineTypeTE) void subroutine1(out vec4 result)\n{\n    result = vec4(3, 4, 5, 6);\n}\n\nsubroutine uniform subroutineTypeTE function;\n\nin TC_DATA\n{\n    vec4 tc_data;\n    vec4 vs_data;\n} tc[];\n\nout TE_DATA\n{\n    vec4 tc_data;\n    vec4 te_data;\n    vec4 vs_data;\n} result;\n\nvoid main()\n{\n    result.vs_data = tc[0].vs_data;\n    result.tc_data = tc[0].tc_data;\n    function(result.te_data);\n}\n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionalTest17::getTessellationEvaluationShaderBody() const
{
	return "#version 400\n"
		   "\n"
		   "#extension GL_ARB_shader_subroutine : require\n"
		   "\n"
		   "layout (quads, point_mode) in;\n"
		   "\n"
		   "subroutine void subroutineTypeTE(out vec4 result);\n"
		   "\n"
		   "subroutine(subroutineTypeTE) void subroutine1(out vec4 result)\n"
		   "{\n"
		   "    result = vec4(3, 4, 5, 6);\n"
		   "}\n"
		   "\n"
		   "subroutine uniform subroutineTypeTE function;\n"
		   "\n"
		   "in TC_DATA\n"
		   "{\n"
		   "    vec4 tc_data;\n"
		   "    vec4 vs_data;\n"
		   "} tc[];\n"
		   "\n"
		   "out TE_DATA\n"
		   "{\n"
		   "    vec4 tc_data;\n"
		   "    vec4 te_data;\n"
		   "    vec4 vs_data;\n"
		   "} result;\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    result.vs_data = tc[0].vs_data;\n"
		   "    result.tc_data = tc[0].tc_data;\n"
		   "    function(result.te_data);\n"
		   "}\n";
}